

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void __thiscall
bk_lib::
pod_vector<std::pair<unsigned_int,_Clasp::ConstraintScore>,_std::allocator<std::pair<unsigned_int,_Clasp::ConstraintScore>_>_>
::append_realloc(pod_vector<std::pair<unsigned_int,_Clasp::ConstraintScore>,_std::allocator<std::pair<unsigned_int,_Clasp::ConstraintScore>_>_>
                 *this,size_type n,pair<unsigned_int,_Clasp::ConstraintScore> *x)

{
  size_type *psVar1;
  pointer ppVar2;
  uint uVar3;
  pair<unsigned_int,_Clasp::ConstraintScore> *__dest;
  uint uVar4;
  
  uVar4 = (this->ebo_).size + n;
  uVar3 = 2 << ((byte)uVar4 & 0x1f);
  if (3 < uVar4) {
    uVar3 = uVar4;
  }
  uVar4 = (this->ebo_).cap * 3 >> 1;
  if (uVar4 < uVar3) {
    uVar4 = uVar3;
  }
  __dest = __gnu_cxx::new_allocator<std::pair<unsigned_int,_Clasp::ConstraintScore>_>::allocate
                     ((new_allocator<std::pair<unsigned_int,_Clasp::ConstraintScore>_> *)this,
                      (ulong)uVar4,(void *)0x0);
  ppVar2 = (this->ebo_).buf;
  if (ppVar2 != (pointer)0x0) {
    memcpy(__dest,ppVar2,(ulong)(this->ebo_).size << 3);
  }
  detail::fill<std::pair<unsigned_int,Clasp::ConstraintScore>>
            (__dest + (this->ebo_).size,__dest + (this->ebo_).size + n,x);
  ppVar2 = (this->ebo_).buf;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  (this->ebo_).buf = __dest;
  (this->ebo_).cap = uVar4;
  psVar1 = &(this->ebo_).size;
  *psVar1 = *psVar1 + n;
  return;
}

Assistant:

void append_realloc(size_type n, const T& x) {
		size_type new_cap = grow_size(n);
		pointer temp      = ebo_.allocate(new_cap);
		if (ebo_.buf) {
			std::memcpy(temp, ebo_.buf, size()*sizeof(T));
		}
		detail::fill(temp+size(), temp+size()+n, x);
		ebo_.release();
		ebo_.buf  = temp;
		ebo_.cap  = new_cap;
		ebo_.size+= n;
	}